

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

double __thiscall Matrix::getMaxValue(Matrix *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = *this->pData;
  if (0 < (long)this->nData) {
    lVar1 = 0;
    do {
      dVar2 = this->pData[lVar1];
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      lVar1 = lVar1 + 1;
      dVar3 = dVar2;
    } while (this->nData != lVar1);
    return dVar2;
  }
  return dVar3;
}

Assistant:

double Matrix::getMaxValue()
{
	double result = pData[0];
	
	for(int i=0; i<nData; i++)
		if (pData[i] > result)
			result = pData[i];

	return result;
}